

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O0

void __thiscall
cmVariableWatch::RemoveWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data)

{
  Pair *this_00;
  iterator this_01;
  bool bVar1;
  size_type sVar2;
  reference ppPVar3;
  const_iterator local_50;
  __normal_iterator<cmVariableWatch::Pair_**,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
  local_48;
  Pair **local_40;
  __normal_iterator<cmVariableWatch::Pair_**,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
  local_38;
  iterator it;
  VectorOfPairs *vp;
  void *client_data_local;
  WatchMethod method_local;
  string *variable_local;
  cmVariableWatch *this_local;
  
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
          ::count(&this->WatchMap,variable);
  if (sVar2 != 0) {
    it._M_current =
         (Pair **)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
                  ::operator[](&this->WatchMap,variable);
    __gnu_cxx::
    __normal_iterator<cmVariableWatch::Pair_**,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
    ::__normal_iterator(&local_38);
    local_40 = (Pair **)std::
                        vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::
                        begin(it._M_current);
    local_38._M_current = local_40;
    while( true ) {
      local_48._M_current =
           (Pair **)std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::
                    end(it._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
      if (!bVar1) break;
      ppPVar3 = __gnu_cxx::
                __normal_iterator<cmVariableWatch::Pair_**,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
                ::operator*(&local_38);
      if (((*ppPVar3)->Method == method) &&
         ((client_data == (void *)0x0 ||
          (ppPVar3 = __gnu_cxx::
                     __normal_iterator<cmVariableWatch::Pair_**,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
                     ::operator*(&local_38), client_data == (*ppPVar3)->ClientData)))) {
        ppPVar3 = __gnu_cxx::
                  __normal_iterator<cmVariableWatch::Pair_**,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
                  ::operator*(&local_38);
        this_00 = *ppPVar3;
        if (this_00 != (Pair *)0x0) {
          Pair::~Pair(this_00);
          operator_delete(this_00,0x18);
        }
        this_01._M_current = it._M_current;
        __gnu_cxx::
        __normal_iterator<cmVariableWatch::Pair*const*,std::vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>>>
        ::__normal_iterator<cmVariableWatch::Pair**>
                  ((__normal_iterator<cmVariableWatch::Pair*const*,std::vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>>>
                    *)&local_50,&local_38);
        std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::erase
                  ((vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_> *)
                   this_01._M_current,local_50);
        return;
      }
      __gnu_cxx::
      __normal_iterator<cmVariableWatch::Pair_**,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
      ::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void cmVariableWatch::RemoveWatch(const std::string& variable,
                                  WatchMethod method,
                                  void* client_data /*=0*/)
{
  if ( !this->WatchMap.count(variable) )
    {
    return;
    }
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::iterator it;
  for ( it = vp->begin(); it != vp->end(); ++it )
    {
    if ( (*it)->Method == method &&
         // If client_data is NULL, we want to disconnect all watches against
         // the given method; otherwise match ClientData as well.
         (!client_data || (client_data == (*it)->ClientData)))
      {
      delete *it;
      vp->erase(it);
      return;
      }
    }
}